

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<MatrixRow,_int>::findPosition
          (HighsHashTable<MatrixRow,_int> *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos,
          u64 *pos)

{
  byte bVar1;
  _Head_base<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_false> _Var2;
  uchar *puVar3;
  u64 uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = ((ulong)key->len * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 >> 0x20 ^
          ((ulong)key->ub + 0x80c8963be3e4c2f3) * ((ulong)key->lb + 0xc8497d2a400d9551)) *
          -0x61c8864680b583eb;
  uVar7 = uVar6 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar7;
  *maxPos = uVar7 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar6 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_false>._M_head_impl;
  *pos = *startPos;
  puVar3 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  do {
    uVar4 = *pos;
    bVar1 = puVar3[uVar4];
    if (-1 < (char)bVar1) {
      return false;
    }
    if ((bVar1 == *meta) &&
       (lVar5._0_4_ = key->lb, lVar5._4_4_ = key->ub,
       key->len == *(uint32_t *)((long)(_Var2._M_head_impl + uVar4) + 8) &&
       lVar5 == *(long *)&_Var2._M_head_impl[uVar4].key_)) {
      return true;
    }
    if ((ulong)((int)uVar4 - (uint)bVar1 & 0x7f) < (uVar4 - *startPos & this->tableSizeMask)) {
      return false;
    }
    uVar6 = this->tableSizeMask & uVar4 + 1;
    *pos = uVar6;
  } while (uVar6 != *maxPos);
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }